

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O1

void canvas_addtemplatesforscalar
               (t_symbol *templatesym,t_word *w,int *p_ntemplates,t_symbol ***p_templatevec)

{
  int iVar1;
  _array *p_Var2;
  t_symbol *templatesym_00;
  int iVar3;
  t_template *ptVar4;
  t_dataslot *ptVar5;
  long lVar6;
  long lVar7;
  t_word *local_58;
  
  ptVar4 = template_findbyname(templatesym);
  canvas_doaddtemplate(templatesym,p_ntemplates,p_templatevec);
  if (ptVar4 != (t_template *)0x0) {
    iVar3 = ptVar4->t_n;
    if (iVar3 != 0) {
      ptVar5 = ptVar4->t_vec;
      local_58 = w;
      do {
        if (ptVar5->ds_type == 3) {
          p_Var2 = local_58->w_array;
          iVar1 = p_Var2->a_elemsize;
          lVar7 = (long)p_Var2->a_n;
          templatesym_00 = ptVar5->ds_arraytemplate;
          canvas_doaddtemplate(templatesym_00,p_ntemplates,p_templatevec);
          if (0 < lVar7) {
            lVar6 = 0;
            do {
              canvas_addtemplatesforscalar
                        (templatesym_00,(t_word *)(p_Var2->a_vec + lVar6),p_ntemplates,p_templatevec
                        );
              lVar6 = lVar6 + iVar1;
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
          }
        }
        iVar3 = iVar3 + -1;
        ptVar5 = ptVar5 + 1;
        local_58 = local_58 + 1;
      } while (iVar3 != 0);
    }
    return;
  }
  bug("canvas_addtemplatesforscalar");
  return;
}

Assistant:

static void canvas_addtemplatesforscalar(t_symbol *templatesym,
    t_word *w, int *p_ntemplates, t_symbol ***p_templatevec)
{
    t_dataslot *ds;
    int i;
    t_template *template = template_findbyname(templatesym);
    canvas_doaddtemplate(templatesym, p_ntemplates, p_templatevec);
    if (!template)
        bug("canvas_addtemplatesforscalar");
    else for (ds = template->t_vec, i = template->t_n; i--; ds++, w++)
    {
        if (ds->ds_type == DT_ARRAY)
        {
            int j;
            t_array *a = w->w_array;
            int elemsize = a->a_elemsize, nitems = a->a_n;
            t_symbol *arraytemplatesym = ds->ds_arraytemplate;
            canvas_doaddtemplate(arraytemplatesym, p_ntemplates, p_templatevec);
            for (j = 0; j < nitems; j++)
                canvas_addtemplatesforscalar(arraytemplatesym,
                    (t_word *)(((char *)a->a_vec) + elemsize * j),
                        p_ntemplates, p_templatevec);
        }
    }
}